

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O1

double __thiscall chrono::utils::MixtureIngredient::calcMinSeparation(MixtureIngredient *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChVector<double> *pCVar3;
  ChVector<double> *pCVar4;
  ChVector<double> *pCVar5;
  undefined1 auVar6 [16];
  
  pCVar3 = &this->m_defSize;
  pCVar4 = &this->m_defSize;
  pCVar5 = &this->m_defSize;
  if (this->m_sizeDist != (normal_distribution<double> *)0x0) {
    pCVar3 = &this->m_maxSize;
    pCVar5 = &this->m_maxSize;
    pCVar4 = &this->m_maxSize;
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = pCVar5->m_data[2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = pCVar4->m_data[1];
  auVar1 = vmaxsd_avx(auVar6,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = pCVar3->m_data[0];
  auVar1 = vmaxsd_avx(auVar1,auVar2);
  return auVar1._0_8_;
}

Assistant:

double MixtureIngredient::calcMinSeparation() {
    if (m_sizeDist)
        return std::max(m_maxSize.x(), std::max(m_maxSize.y(), m_maxSize.z()));

    return std::max(m_defSize.x(), std::max(m_defSize.y(), m_defSize.z()));
}